

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O0

Box<Imath_2_5::Vec3<float>_> *
Imath_2_5::transform<float,float>(Box<Imath_2_5::Vec3<float>_> *box,Matrix44<float> *m)

{
  bool bVar1;
  float *pfVar2;
  Matrix44<float> *in_RDX;
  Vec3<float> *in_RSI;
  Box<Imath_2_5::Vec3<float>_> *in_RDI;
  float fVar3;
  int i_1;
  Vec3<float> points [8];
  float b;
  float a;
  int j;
  int i;
  Box<Imath_2_5::Vec3<float>_> *newBox;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float fVar4;
  undefined4 in_stack_ffffffffffffff18;
  float fVar5;
  undefined4 in_stack_ffffffffffffff1c;
  Box<Imath_2_5::Vec3<float>_> *in_stack_ffffffffffffff28;
  Vec3<float> *pVVar6;
  Vec3<float> *local_d0;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_8c;
  Matrix44<float> *in_stack_ffffffffffffff80;
  Vec3<float> *in_stack_ffffffffffffff88;
  Vec3<float> VStack_70;
  Vec3<float> VStack_64;
  Vec3<float> VStack_58;
  Vec3<float> VStack_4c;
  Vec3<float> VStack_40;
  Vec3<float> VStack_34;
  Vec3<float> local_28;
  int local_1c;
  Matrix44<float> *local_18;
  Vec3<float> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = Box<Imath_2_5::Vec3<float>_>::isEmpty
                    ((Box<Imath_2_5::Vec3<float>_> *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if ((bVar1) ||
     (bVar1 = Box<Imath_2_5::Vec3<float>_>::isInfinite(in_stack_ffffffffffffff28), bVar1)) {
    Box<Imath_2_5::Vec3<float>_>::Box
              ((Box<Imath_2_5::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (Box<Imath_2_5::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  else {
    pfVar2 = Matrix44<float>::operator[](local_18,0);
    if ((pfVar2[3] == 0.0) && (!NAN(pfVar2[3]))) {
      pfVar2 = Matrix44<float>::operator[](local_18,1);
      if ((pfVar2[3] == 0.0) && (!NAN(pfVar2[3]))) {
        pfVar2 = Matrix44<float>::operator[](local_18,2);
        if ((pfVar2[3] == 0.0) && (!NAN(pfVar2[3]))) {
          pfVar2 = Matrix44<float>::operator[](local_18,3);
          if ((pfVar2[3] == 1.0) && (!NAN(pfVar2[3]))) {
            Box<Imath_2_5::Vec3<float>_>::Box
                      ((Box<Imath_2_5::Vec3<float>_> *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
              pfVar2 = Matrix44<float>::operator[](local_18,3);
              fVar3 = pfVar2[local_1c];
              pfVar2 = Vec3<float>::operator[](&in_RDI->max,local_1c);
              *pfVar2 = fVar3;
              pfVar2 = Vec3<float>::operator[](&in_RDI->min,local_1c);
              *pfVar2 = fVar3;
              for (local_28.z = 0.0; (int)local_28.z < 3; local_28.z = (float)((int)local_28.z + 1))
              {
                pfVar2 = Matrix44<float>::operator[](local_18,(int)local_28.z);
                fVar3 = pfVar2[local_1c];
                pfVar2 = Vec3<float>::operator[](local_10,(int)local_28.z);
                local_28.y = fVar3 * *pfVar2;
                pfVar2 = Matrix44<float>::operator[](local_18,(int)local_28.z);
                fVar3 = pfVar2[local_1c];
                pfVar2 = Vec3<float>::operator[](local_10 + 1,(int)local_28.z);
                fVar4 = local_28.y;
                fVar3 = fVar3 * *pfVar2;
                local_28.x = fVar3;
                if (fVar3 <= local_28.y) {
                  pfVar2 = Vec3<float>::operator[](&in_RDI->min,local_1c);
                  fVar4 = local_28.y;
                  *pfVar2 = fVar3 + *pfVar2;
                  pfVar2 = Vec3<float>::operator[](&in_RDI->max,local_1c);
                  *pfVar2 = fVar4 + *pfVar2;
                }
                else {
                  pfVar2 = Vec3<float>::operator[](&in_RDI->min,local_1c);
                  *pfVar2 = fVar4 + *pfVar2;
                  fVar3 = local_28.x;
                  pfVar2 = Vec3<float>::operator[](&in_RDI->max,local_1c);
                  *pfVar2 = fVar3 + *pfVar2;
                }
              }
            }
            return in_RDI;
          }
        }
      }
    }
    local_d0 = (Vec3<float> *)&stack0xffffffffffffff78;
    pVVar6 = &local_28;
    do {
      Vec3<float>::Vec3(local_d0);
      local_d0 = local_d0 + 1;
    } while (local_d0 != pVVar6);
    pfVar2 = Vec3<float>::operator[](local_10,0);
    fVar3 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_64,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_70,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffff84,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffff78,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](local_10 + 1,0);
    fVar3 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_34,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_40,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_4c,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_58,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](local_10,1);
    fVar3 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_4c,1);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_58,1);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffff84,1);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffff78,1);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](local_10 + 1,1);
    fVar4 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_34,1);
    *pfVar2 = fVar4;
    pfVar2 = Vec3<float>::operator[](&VStack_40,1);
    *pfVar2 = fVar4;
    pfVar2 = Vec3<float>::operator[](&VStack_64,1);
    *pfVar2 = fVar4;
    pfVar2 = Vec3<float>::operator[](&VStack_70,1);
    *pfVar2 = fVar4;
    pfVar2 = Vec3<float>::operator[](local_10,2);
    fVar5 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_40,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](&VStack_58,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](&VStack_70,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffff78,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](local_10 + 1,2);
    fVar5 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_34,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](&VStack_4c,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](&VStack_64,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffff84,2);
    *pfVar2 = fVar5;
    Box<Imath_2_5::Vec3<float>_>::Box((Box<Imath_2_5::Vec3<float>_> *)CONCAT44(fVar4,fVar3));
    for (local_8c = 0; local_8c < 8; local_8c = local_8c + 1) {
      operator*(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      Box<Imath_2_5::Vec3<float>_>::extendBy
                ((Box<Imath_2_5::Vec3<float>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
  }
  return in_RDI;
}

Assistant:

Box< Vec3<S> >
transform (const Box< Vec3<S> > &box, const Matrix44<T> &m)
{
    //
    // Transform a 3D box by a matrix, and compute a new box that
    // tightly encloses the transformed box.
    //
    // If m is an affine transform, then we use James Arvo's fast
    // method as described in "Graphics Gems", Academic Press, 1990,
    // pp. 548-550.
    //

    //
    // A transformed empty box is still empty, and a transformed infinite box
    // is still infinite
    //

    if (box.isEmpty() || box.isInfinite())
	return box;

    //
    // If the last column of m is (0 0 0 1) then m is an affine
    // transform, and we use the fast Graphics Gems trick.
    //

    if (m[0][3] == 0 && m[1][3] == 0 && m[2][3] == 0 && m[3][3] == 1)
    {
	Box< Vec3<S> > newBox;

	for (int i = 0; i < 3; i++) 
        {
	    newBox.min[i] = newBox.max[i] = (S) m[3][i];

	    for (int j = 0; j < 3; j++) 
            {
		S a, b;

		a = (S) m[j][i] * box.min[j];
		b = (S) m[j][i] * box.max[j];

		if (a < b) 
                {
		    newBox.min[i] += a;
		    newBox.max[i] += b;
		}
		else 
                {
		    newBox.min[i] += b;
		    newBox.max[i] += a;
		}
	    }
	}

	return newBox;
    }

    //
    // M is a projection matrix.  Do things the naive way:
    // Transform the eight corners of the box, and find an
    // axis-parallel box that encloses the transformed corners.
    //

    Vec3<S> points[8];

    points[0][0] = points[1][0] = points[2][0] = points[3][0] = box.min[0];
    points[4][0] = points[5][0] = points[6][0] = points[7][0] = box.max[0];

    points[0][1] = points[1][1] = points[4][1] = points[5][1] = box.min[1];
    points[2][1] = points[3][1] = points[6][1] = points[7][1] = box.max[1];

    points[0][2] = points[2][2] = points[4][2] = points[6][2] = box.min[2];
    points[1][2] = points[3][2] = points[5][2] = points[7][2] = box.max[2];

    Box< Vec3<S> > newBox;

    for (int i = 0; i < 8; i++) 
	newBox.extendBy (points[i] * m);

    return newBox;
}